

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

int Gem_GroupUnpack(int Groups,int *pVars)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = 0;
  if (Groups != 0) {
    iVar3 = 0;
    do {
      if ((Groups & 1U) != 0) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        pVars[lVar4] = iVar3;
      }
      iVar3 = iVar3 + 1;
      bVar1 = 1 < (uint)Groups;
      Groups = Groups >> 1;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

int Gem_GroupUnpack( int Groups, int * pVars )
{
    int v, nGroups = 0;
    for ( v = 0; Groups; v++, Groups >>= 1 )
        if ( Groups & 1 )
            pVars[nGroups++] = v;
    return nGroups;
}